

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

double __thiscall
mp::
PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::inverse_1st(PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
              *this,double y)

{
  const_reference pvVar1;
  double in_XMM0_Qa;
  array<double,_1UL> *this_00;
  double dVar2;
  double x00;
  array<double,_1UL> *in_stack_ffffffffffffffd0;
  double local_8;
  
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ::GetConParams((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                  *)0x534219);
  pvVar1 = std::array<double,_1UL>::operator[](in_stack_ffffffffffffffd0,(size_type)in_XMM0_Qa);
  this_00 = (array<double,_1UL> *)ABS(in_XMM0_Qa / *pvVar1);
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ::GetConParams((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                  *)0x534249);
  pvVar1 = std::array<double,_1UL>::operator[](this_00,(size_type)in_XMM0_Qa);
  local_8 = pow((double)this_00,1.0 / (*pvVar1 - 1.0));
  dVar2 = BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
          ::lb_sub((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                    *)0x53428c);
  if (dVar2 < 0.0) {
    local_8 = -local_8;
  }
  return local_8;
}

Assistant:

double inverse_1st(double y) const override {
    auto x00 = std::pow(
          std::fabs(y / GetConParams()[0]),
        1.0 / (GetConParams()[0]-1) );
    if (lb_sub()<0.0)           // subinterval before 0
      return -x00;
    return x00;
  }